

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationFractionalSpacingTests.cpp
# Opt level: O0

bool vkt::tessellation::anon_unknown_0::verifyFractionalSpacingMultiple
               (TestLog *log,SpacingMode spacingMode,
               vector<float,_std::allocator<float>_> *tessLevels,
               vector<float,_std::allocator<float>_> *additionalSegmentLengths,
               vector<int,_std::allocator<int>_> *additionalSegmentLocations)

{
  MemberPred<std::less<float>,_vkt::tessellation::(anonymous_namespace)::LineData,_float> pred;
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  MessageBuilder *pMVar5;
  TestLog *pTVar6;
  offset_in_LineData_to_float membP;
  undefined4 in_register_00000034;
  value_type *__x;
  float fVar7;
  float fVar8;
  offset_in_LineData_to_float in_stack_fffffffffffff618;
  undefined8 in_stack_fffffffffffff620;
  MessageBuilder local_868;
  MessageBuilder local_6e8;
  MessageBuilder local_568;
  float local_3e8;
  float local_3e4;
  float prevFraction;
  float curFraction;
  int prevFinalLevel;
  int curFinalLevel;
  float prevClampedLevel;
  float curClampedLevel;
  LineData *prevData_1;
  LineData *curData_1;
  int local_3b8;
  int lineNdx_1;
  MessageBuilder local_3b0;
  MessageBuilder local_230;
  const_reference local_b0;
  LineData *prevData;
  LineData *curData;
  vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
  *pvStack_98;
  int lineNdx;
  undefined1 local_88 [8];
  vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
  lineDatasSortedByLevel;
  LineData local_60;
  int local_54;
  undefined1 local_50 [4];
  int i;
  vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
  lineDatas;
  vector<int,_std::allocator<int>_> *additionalSegmentLocations_local;
  vector<float,_std::allocator<float>_> *additionalSegmentLengths_local;
  vector<float,_std::allocator<float>_> *tessLevels_local;
  SpacingMode spacingMode_local;
  TestLog *log_local;
  
  __x = (value_type *)CONCAT44(in_register_00000034,spacingMode);
  lineDatas.
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)additionalSegmentLocations;
  std::
  vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
  ::vector((vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
            *)local_50);
  for (local_54 = 0; iVar1 = local_54,
      sVar2 = std::vector<float,_std::allocator<float>_>::size(tessLevels), iVar1 < (int)sVar2;
      local_54 = local_54 + 1) {
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](tessLevels,(long)local_54);
    fVar7 = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (additionalSegmentLengths,(long)local_54);
    fVar8 = *pvVar3;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        lineDatas.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_54);
    LineData::LineData(&local_60,fVar7,fVar8,*pvVar4);
    __x = &local_60;
    std::
    vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
    ::push_back((vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                 *)local_50,__x);
  }
  pvStack_98 = (vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                *)tessellation::(anonymous_namespace)::
                  memberPred<std::less,vkt::tessellation::(anonymous_namespace)::LineData,float>
                            ((MemberPred<std::less<float>,_vkt::tessellation::(anonymous_namespace)::LineData,_float>
                              *)0x0,(_anonymous_namespace_ *)__x,membP);
  pred._8_8_ = in_stack_fffffffffffff620;
  pred.m_membP = in_stack_fffffffffffff618;
  sorted<vkt::tessellation::(anonymous_namespace)::LineData,vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,vkt::tessellation::(anonymous_namespace)::LineData,float>>
            ((vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
              *)local_88,(tessellation *)local_50,pvStack_98,pred);
  for (curData._4_4_ = 1; iVar1 = curData._4_4_,
      sVar2 = std::
              vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
              ::size((vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                      *)local_88), iVar1 < (int)sVar2; curData._4_4_ = curData._4_4_ + 1) {
    prevData = std::
               vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
               ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                             *)local_88,(long)curData._4_4_);
    local_b0 = std::
               vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
               ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                             *)local_88,(long)(curData._4_4_ + -1));
    if ((-1 < prevData->additionalSegmentLocation) && (-1 < local_b0->additionalSegmentLocation)) {
      fVar7 = getClampedTessLevel(spacingMode,prevData->tessLevel);
      fVar8 = getClampedTessLevel(spacingMode,local_b0->tessLevel);
      if ((fVar7 == fVar8) &&
         ((!NAN(fVar7) && !NAN(fVar8) &&
          (prevData->additionalSegmentLocation != local_b0->additionalSegmentLocation)))) {
        tcu::TestLog::operator<<(&local_3b0,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_3b0,
                            (char (*) [110])
                            "Failure: additional segments not located identically for two edges with identical clamped tessellation levels"
                           );
        pTVar6 = tcu::MessageBuilder::operator<<
                           (pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::TestLog::operator<<(&local_230,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_230,(char (*) [31])"Note: tessellation levels are ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&prevData->tessLevel);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [6])0x12fcbb9);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_b0->tessLevel);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [17])" (clamped level ");
        lineNdx_1 = (int)getClampedTessLevel(spacingMode,prevData->tessLevel);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)&lineNdx_1);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x13159c9);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [52])
                                   "; but first additional segments located at indices ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&prevData->additionalSegmentLocation);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [6])0x12fcbb9);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_b0->additionalSegmentLocation);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [15])0x1373bf0);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_230);
        tcu::MessageBuilder::~MessageBuilder(&local_3b0);
        log_local._7_1_ = 0;
        local_3b8 = 1;
        goto LAB_00deec69;
      }
    }
  }
  curData_1._4_4_ = 1;
  do {
    iVar1 = curData_1._4_4_;
    sVar2 = std::
            vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
            ::size((vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                    *)local_88);
    if ((int)sVar2 <= iVar1) {
      local_3b8 = 0;
LAB_00deec69:
      std::
      vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
      ::~vector((vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                 *)local_88);
      if (local_3b8 == 0) {
        log_local._7_1_ = 1;
        local_3b8 = 1;
      }
      std::
      vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
      ::~vector((vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                 *)local_50);
      return (bool)(log_local._7_1_ & 1);
    }
    prevData_1 = std::
                 vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                 ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                               *)local_88,(long)curData_1._4_4_);
    _prevClampedLevel =
         std::
         vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
         ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                       *)local_88,(long)(curData_1._4_4_ + -1));
    if ((0.0 < prevData_1->additionalSegmentLength || prevData_1->additionalSegmentLength == 0.0) &&
       (0.0 < _prevClampedLevel->additionalSegmentLength ||
        _prevClampedLevel->additionalSegmentLength == 0.0)) {
      curFinalLevel = (int)getClampedTessLevel(spacingMode,prevData_1->tessLevel);
      prevFinalLevel = (int)getClampedTessLevel(spacingMode,_prevClampedLevel->tessLevel);
      curFraction = (float)getRoundedTessLevel(spacingMode,(float)curFinalLevel);
      prevFraction = (float)getRoundedTessLevel(spacingMode,(float)prevFinalLevel);
      if (curFraction == prevFraction) {
        local_3e4 = (float)(int)curFraction - (float)curFinalLevel;
        local_3e8 = (float)(int)prevFraction - (float)prevFinalLevel;
        if (_prevClampedLevel->additionalSegmentLength <= prevData_1->additionalSegmentLength) {
          if ((((float)curFinalLevel != (float)prevFinalLevel) ||
              (NAN((float)curFinalLevel) || NAN((float)prevFinalLevel))) ||
             ((prevData_1->additionalSegmentLength == _prevClampedLevel->additionalSegmentLength &&
              (!NAN(prevData_1->additionalSegmentLength) &&
               !NAN(_prevClampedLevel->additionalSegmentLength))))) goto LAB_00deec4b;
        }
        tcu::TestLog::operator<<(&local_868,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_868,
                            (char (*) [142])
                            "Failure: additional segment length isn\'t monotonically decreasing with the fraction <n> - <f>, among edges with same final tessellation level"
                           );
        pTVar6 = tcu::MessageBuilder::operator<<
                           (pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::TestLog::operator<<(&local_6e8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_6e8,
                            (char (*) [115])
                            "Note: <f> stands for the clamped tessellation level and <n> for the final (rounded and clamped) tessellation level"
                           );
        pTVar6 = tcu::MessageBuilder::operator<<
                           (pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::TestLog::operator<<(&local_568,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_568,(char (*) [42])"Note: two edges have tessellation levels ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&_prevClampedLevel->tessLevel);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [6])0x12fcbb9);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&prevData_1->tessLevel);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [14])0x1373bf1);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])", clamped ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)&prevFinalLevel);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [6])0x12fcbb9);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)&curFinalLevel);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [9])", final ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)&prevFraction);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [6])0x12fcbb9);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)&curFraction);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [17])"; fractions are ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_3e8);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [6])0x12fcbb9);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_3e4);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [35])", but resulted in segment lengths ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&_prevClampedLevel->additionalSegmentLength)
        ;
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [6])0x12fcbb9);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&prevData_1->additionalSegmentLength);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_568);
        tcu::MessageBuilder::~MessageBuilder(&local_6e8);
        tcu::MessageBuilder::~MessageBuilder(&local_868);
        log_local._7_1_ = 0;
        local_3b8 = 1;
        goto LAB_00deec69;
      }
    }
LAB_00deec4b:
    curData_1._4_4_ = curData_1._4_4_ + 1;
  } while( true );
}

Assistant:

static bool verifyFractionalSpacingMultiple (tcu::TestLog&				log,
											 const SpacingMode			spacingMode,
											 const std::vector<float>&	tessLevels,
											 const std::vector<float>&	additionalSegmentLengths,
											 const std::vector<int>&	additionalSegmentLocations)
{
	DE_ASSERT(spacingMode == SPACINGMODE_FRACTIONAL_ODD || spacingMode == SPACINGMODE_FRACTIONAL_EVEN);
	DE_ASSERT(tessLevels.size() == additionalSegmentLengths.size() && tessLevels.size() == additionalSegmentLocations.size());

	std::vector<LineData> lineDatas;

	for (int i = 0; i < static_cast<int>(tessLevels.size()); ++i)
		lineDatas.push_back(LineData(tessLevels[i], additionalSegmentLengths[i], additionalSegmentLocations[i]));

	{
		const std::vector<LineData> lineDatasSortedByLevel = sorted(lineDatas, memberPred<std::less>(&LineData::tessLevel));

		// Check that lines with identical clamped tessellation levels have identical additionalSegmentLocation.

		for (int lineNdx = 1; lineNdx < static_cast<int>(lineDatasSortedByLevel.size()); ++lineNdx)
		{
			const LineData& curData		= lineDatasSortedByLevel[lineNdx];
			const LineData& prevData	= lineDatasSortedByLevel[lineNdx-1];

			if (curData.additionalSegmentLocation < 0 || prevData.additionalSegmentLocation < 0)
				continue; // Unknown locations, skip.

			if (getClampedTessLevel(spacingMode, curData.tessLevel) == getClampedTessLevel(spacingMode, prevData.tessLevel) &&
				curData.additionalSegmentLocation != prevData.additionalSegmentLocation)
			{
				log << tcu::TestLog::Message << "Failure: additional segments not located identically for two edges with identical clamped tessellation levels" << tcu::TestLog::EndMessage
					<< tcu::TestLog::Message << "Note: tessellation levels are " << curData.tessLevel << " and " << prevData.tessLevel
											 << " (clamped level " << getClampedTessLevel(spacingMode, curData.tessLevel) << ")"
											 << "; but first additional segments located at indices "
											 << curData.additionalSegmentLocation << " and " << prevData.additionalSegmentLocation << ", respectively" << tcu::TestLog::EndMessage;
				return false;
			}
		}

		// Check that, among lines with same clamped rounded tessellation level, additionalSegmentLength is monotonically decreasing with "clampedRoundedTessLevel - clampedTessLevel" (the "fraction").

		for (int lineNdx = 1; lineNdx < static_cast<int>(lineDatasSortedByLevel.size()); ++lineNdx)
		{
			const LineData&		curData				= lineDatasSortedByLevel[lineNdx];
			const LineData&		prevData			= lineDatasSortedByLevel[lineNdx-1];

			if (curData.additionalSegmentLength < 0.0f || prevData.additionalSegmentLength < 0.0f)
				continue; // Unknown segment lengths, skip.

			const float			curClampedLevel		= getClampedTessLevel(spacingMode, curData.tessLevel);
			const float			prevClampedLevel	= getClampedTessLevel(spacingMode, prevData.tessLevel);
			const int			curFinalLevel		= getRoundedTessLevel(spacingMode, curClampedLevel);
			const int			prevFinalLevel		= getRoundedTessLevel(spacingMode, prevClampedLevel);

			if (curFinalLevel != prevFinalLevel)
				continue;

			const float			curFraction		= static_cast<float>(curFinalLevel) - curClampedLevel;
			const float			prevFraction	= static_cast<float>(prevFinalLevel) - prevClampedLevel;

			if (curData.additionalSegmentLength < prevData.additionalSegmentLength ||
				(curClampedLevel == prevClampedLevel && curData.additionalSegmentLength != prevData.additionalSegmentLength))
			{
				log << tcu::TestLog::Message << "Failure: additional segment length isn't monotonically decreasing with the fraction <n> - <f>, among edges with same final tessellation level" << tcu::TestLog::EndMessage
					<< tcu::TestLog::Message << "Note: <f> stands for the clamped tessellation level and <n> for the final (rounded and clamped) tessellation level" << tcu::TestLog::EndMessage
					<< tcu::TestLog::Message << "Note: two edges have tessellation levels " << prevData.tessLevel << " and " << curData.tessLevel << " respectively"
											 << ", clamped " << prevClampedLevel << " and " << curClampedLevel << ", final " << prevFinalLevel << " and " << curFinalLevel
											 << "; fractions are " << prevFraction << " and " << curFraction
											 << ", but resulted in segment lengths " << prevData.additionalSegmentLength << " and " << curData.additionalSegmentLength << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	return true;
}